

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count.hpp
# Opt level: O0

size_type trial::dynamic::key::count<std::allocator<char>,char[8]>
                    (basic_variable<std::allocator<char>_> *self,char (*other) [8])

{
  bool bVar1;
  type tVar2;
  value vVar3;
  const_reference lhs;
  key_iterator local_c8;
  undefined1 local_78 [8];
  key_iterator it;
  size_type result;
  char (*other_local) [8];
  basic_variable<std::allocator<char>_> *self_local;
  
  vVar3 = basic_variable<std::allocator<char>_>::symbol(self);
  if (vVar3 == null) {
    self_local = (basic_variable<std::allocator<char>_> *)0x0;
  }
  else if (vVar3 - boolean < 7) {
    tVar2 = dynamic::operator==(self,other);
    self_local = (basic_variable<std::allocator<char>_> *)(long)(int)(uint)tVar2;
  }
  else {
    it.index.storage._40_8_ = 0;
    basic_variable<std::allocator<char>_>::key_begin((key_iterator *)local_78,self);
    while( true ) {
      basic_variable<std::allocator<char>_>::key_end(&local_c8,self);
      bVar1 = basic_variable<std::allocator<char>_>::key_iterator::operator!=
                        ((key_iterator *)local_78,&local_c8);
      basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_c8);
      if (!bVar1) break;
      lhs = basic_variable<std::allocator<char>_>::key_iterator::operator*((key_iterator *)local_78)
      ;
      tVar2 = dynamic::operator==(lhs,other);
      if (tVar2) {
        it.index.storage._40_8_ = it.index.storage._40_8_ + 1;
      }
      basic_variable<std::allocator<char>_>::key_iterator::operator++((key_iterator *)local_78);
    }
    basic_variable<std::allocator<char>_>::key_iterator::~key_iterator((key_iterator *)local_78);
    self_local = (basic_variable<std::allocator<char>_> *)it.index.storage._40_8_;
  }
  return (size_type)self_local;
}

Assistant:

auto count(const basic_variable<Allocator>& self,
           const T& other) -> typename basic_variable<Allocator>::size_type
{
    switch (self.symbol())
    {
    case symbol::null:
        return 0;

    case symbol::boolean:
    case symbol::integer:
    case symbol::real:
    case symbol::string:
    case symbol::wstring:
    case symbol::u16string:
    case symbol::u32string:
        return (self == other) ? 1 : 0;

    case symbol::array:
    case symbol::map:
        {
            typename basic_variable<Allocator>::size_type result = 0;
            for (auto it = self.key_begin(); it != self.key_end(); ++it)
            {
                if (*it == other)
                    ++result;
            }
            return result;
        }
    }
    TRIAL_DYNAMIC_UNREACHABLE();
}